

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O3

Properties * __thiscall
QFontEngine::properties(Properties *__return_storage_ptr__,QFontEngine *this)

{
  QArrayData *pQVar1;
  char *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  longlong __old_val_1;
  undefined8 *puVar11;
  Properties *pPVar12;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  longlong __old_val;
  QArrayData *local_198;
  char *pcStack_190;
  qsizetype local_188;
  QArrayData *local_178;
  char *pcStack_170;
  qsizetype local_168;
  QByteArray local_160;
  QByteArray local_148;
  QByteArray local_128;
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray> local_110;
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray> local_d8;
  undefined1 local_a0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar11 = &DAT_006a81e8;
  pPVar12 = __return_storage_ptr__;
  for (lVar10 = 0xe; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pPVar12->postscriptName).d.d = (Data *)*puVar11;
    puVar11 = puVar11 + 1;
    pPVar12 = (Properties *)&(pPVar12->postscriptName).d.ptr;
  }
  __return_storage_ptr__->leading = 0;
  __return_storage_ptr__->italicAngle = 0;
  __return_storage_ptr__->capHeight = 0;
  __return_storage_ptr__->lineWidth = 0;
  __return_storage_ptr__->emSquare = 0;
  __return_storage_ptr__->ascent = 0;
  __return_storage_ptr__->descent = 0;
  __return_storage_ptr__->leading = 0;
  (__return_storage_ptr__->boundingBox).w = 0.0;
  (__return_storage_ptr__->boundingBox).h = 0.0;
  (__return_storage_ptr__->boundingBox).xp = 0.0;
  (__return_storage_ptr__->boundingBox).yp = 0.0;
  (__return_storage_ptr__->copyright).d.ptr = (char *)0x0;
  (__return_storage_ptr__->copyright).d.size = 0;
  (__return_storage_ptr__->postscriptName).d.size = 0;
  (__return_storage_ptr__->copyright).d.d = (Data *)0x0;
  (__return_storage_ptr__->postscriptName).d.d = (Data *)0x0;
  (__return_storage_ptr__->postscriptName).d.ptr = (char *)0x0;
  QString::toUtf8_helper((QString *)&local_160);
  convertToPostscriptFontFamilyName(&local_148,&local_160);
  qVar6 = local_148.d.size;
  pcVar5 = local_148.d.ptr;
  pDVar4 = local_148.d.d;
  local_148.d.size = 0;
  local_148.d.d = (Data *)0x0;
  local_148.d.ptr = (char *)0x0;
  QByteArray::number((uint)&local_178,*(uint *)&(this->fontDef).field_0x60 >> 0x1c & 3);
  qVar3 = local_168;
  pcVar2 = pcStack_170;
  pQVar1 = local_178;
  local_110.a.b = '-';
  local_168 = 0;
  local_110.a.a.d.d = (Data *)0x0;
  local_110.a.a.d.ptr = (char *)0x0;
  local_110.a.a.d.size = 0;
  local_d8.a.b = '-';
  local_110.b.d.d = (Data *)0x0;
  local_110.b.d.ptr = (char *)0x0;
  local_110.b.d.size = 0;
  local_a0 = 0x2d;
  local_178 = (QArrayData *)0x0;
  pcStack_170 = (char *)0x0;
  QByteArray::number((uint)&local_198,
                     (uint)((ulong)*(undefined8 *)&(this->fontDef).field_0x60 >> 0x28) & 0x3ff);
  local_98.b.d.size = local_188;
  local_98.b.d.ptr = pcStack_190;
  local_98.b.d.d = (Data *)local_198;
  local_d8.a.a.d.d = (Data *)0x0;
  local_d8.a.a.d.ptr = (char *)0x0;
  local_98.a.a.a.a.d.d = pDVar4;
  local_98.a.a.a.a.d.ptr = pcVar5;
  local_d8.a.a.d.size = 0;
  local_98.a.a.a.a.d.size = qVar6;
  local_98.a.a.a.b = '-';
  local_d8.b.d.d = (Data *)0x0;
  local_d8.b.d.ptr = (char *)0x0;
  local_98.a.a.b.d.d = (Data *)pQVar1;
  local_98.a.a.b.d.ptr = pcVar2;
  local_d8.b.d.size = 0;
  local_98.a.a.b.d.size = qVar3;
  local_98.a.b = '-';
  local_198 = (QArrayData *)0x0;
  pcStack_190 = (char *)0x0;
  local_188 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  ::convertTo<QByteArray>(&local_128,&local_98);
  pQVar1 = &((__return_storage_ptr__->postscriptName).d.d)->super_QArrayData;
  pcVar2 = (__return_storage_ptr__->postscriptName).d.ptr;
  (__return_storage_ptr__->postscriptName).d.d = local_128.d.d;
  (__return_storage_ptr__->postscriptName).d.ptr = local_128.d.ptr;
  qVar3 = (__return_storage_ptr__->postscriptName).d.size;
  (__return_storage_ptr__->postscriptName).d.size = local_128.d.size;
  local_128.d.d = (Data *)pQVar1;
  local_128.d.ptr = pcVar2;
  local_128.d.size = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  ::~QStringBuilder(&local_98);
  if (local_198 != (QArrayData *)0x0) {
    LOCK();
    (local_198->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_198->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_198->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_198,1,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>::~QStringBuilder(&local_d8);
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>::~QStringBuilder(&local_110);
  if (local_178 != (QArrayData *)0x0) {
    LOCK();
    (local_178->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_178->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_178->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_178,1,0x10);
    }
  }
  if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_160.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_160.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_160.d.d)->super_QArrayData,1,0x10);
    }
  }
  iVar7 = (*this->_vptr_QFontEngine[0x1e])(this);
  (__return_storage_ptr__->ascent).val = iVar7;
  iVar8 = (*this->_vptr_QFontEngine[0x20])(this);
  (__return_storage_ptr__->descent).val = iVar8;
  iVar9 = (*this->_vptr_QFontEngine[0x21])(this);
  (__return_storage_ptr__->leading).val = iVar9;
  (__return_storage_ptr__->emSquare).val = iVar7;
  (*this->_vptr_QFontEngine[0x26])(this);
  (__return_storage_ptr__->boundingBox).xp = 0.0;
  (__return_storage_ptr__->boundingBox).yp = (double)iVar7 * -0.015625;
  (__return_storage_ptr__->boundingBox).w = (qreal)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  (__return_storage_ptr__->boundingBox).h = (double)(iVar8 + iVar7) * 0.015625;
  (__return_storage_ptr__->italicAngle).val = 0;
  (__return_storage_ptr__->capHeight).val = iVar7;
  iVar7 = (*this->_vptr_QFontEngine[0x24])(this);
  (__return_storage_ptr__->lineWidth).val = iVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QFontEngine::Properties QFontEngine::properties() const
{
    Properties p;
    p.postscriptName =
            QFontEngine::convertToPostscriptFontFamilyName(fontDef.families.first().toUtf8()) + '-'
            + QByteArray::number(fontDef.style) + '-' + QByteArray::number(fontDef.weight);
    p.ascent = ascent();
    p.descent = descent();
    p.leading = leading();
    p.emSquare = p.ascent;
    p.boundingBox = QRectF(0, -p.ascent.toReal(), maxCharWidth(), (p.ascent + p.descent).toReal());
    p.italicAngle = 0;
    p.capHeight = p.ascent;
    p.lineWidth = lineThickness();
    return p;
}